

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QWidget * containerWidget(QWidget *w)

{
  QLineEdit *pQVar1;
  QComboBox *pQVar2;
  QAbstractSpinBox *pQVar3;
  QAbstractScrollArea *this;
  QWidget *pQVar4;
  
  pQVar1 = QtPrivate::qobject_cast_helper<QLineEdit_const*,QObject_const>(&w->super_QObject);
  if (pQVar1 != (QLineEdit *)0x0) {
    pQVar2 = QtPrivate::qobject_cast_helper<QComboBox_const*,QObject>
                       (*(QObject **)(*(long *)&w->field_0x8 + 0x10));
    pQVar4 = *(QWidget **)(*(long *)&w->field_0x8 + 0x10);
    if (pQVar2 != (QComboBox *)0x0) {
      return pQVar4;
    }
    pQVar3 = QtPrivate::qobject_cast_helper<QAbstractSpinBox_const*,QObject>(&pQVar4->super_QObject)
    ;
    if (pQVar3 != (QAbstractSpinBox *)0x0) goto LAB_0034cc6c;
  }
  this = (QAbstractScrollArea *)
         QtPrivate::qobject_cast_helper<QAbstractScrollArea_const*,QObject>
                   (*(QObject **)(*(long *)&w->field_0x8 + 0x10));
  if (this == (QAbstractScrollArea *)0x0) {
    return w;
  }
  pQVar4 = QAbstractScrollArea::viewport(this);
  if (pQVar4 != w) {
    return w;
  }
LAB_0034cc6c:
  return *(QWidget **)(*(long *)&w->field_0x8 + 0x10);
}

Assistant:

static QWidget *containerWidget(const QWidget *w)
{
#if QT_CONFIG(lineedit)
    if (qobject_cast<const QLineEdit *>(w)) {
        //if the QLineEdit is an embeddedWidget, we need the rule of the real widget
#if QT_CONFIG(combobox)
        if (qobject_cast<const QComboBox *>(w->parentWidget()))
            return w->parentWidget();
#endif
#if QT_CONFIG(spinbox)
        if (qobject_cast<const QAbstractSpinBox *>(w->parentWidget()))
            return w->parentWidget();
#endif
    }
#endif // QT_CONFIG(lineedit)

#if QT_CONFIG(scrollarea)
    if (const QAbstractScrollArea *sa = qobject_cast<const QAbstractScrollArea *>(w->parentWidget())) {
        if (sa->viewport() == w)
            return w->parentWidget();
    }
#endif

    return const_cast<QWidget *>(w);
}